

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  GCtab *pGVar4;
  ulong uVar5;
  long lVar6;
  
  pGVar4 = newtab(L,asize,hbits);
  uVar1 = pGVar4->asize;
  if ((ulong)uVar1 != 0) {
    uVar2 = (pGVar4->array).ptr32;
    uVar5 = 0;
    do {
      *(undefined4 *)((ulong)uVar2 + 4 + uVar5 * 8) = 0xffffffff;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  uVar3 = pGVar4->hmask;
  if (uVar3 != 0) {
    uVar5 = (ulong)(pGVar4->node).ptr32;
    lVar6 = 0;
    do {
      *(undefined8 *)(uVar5 + 0xc + lVar6) = 0xffffffff;
      *(undefined4 *)(uVar5 + 4 + lVar6) = 0xffffffff;
      lVar6 = lVar6 + 0x18;
    } while ((ulong)(uVar3 + 1 + (uint)(uVar3 == 0xffffffff)) * 0x18 != lVar6);
  }
  return pGVar4;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}